

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O2

Log * __thiscall FIX::FileLogFactory::create(FileLogFactory *this,SessionID *s)

{
  bool bVar1;
  FileLog *this_00;
  Dictionary *pDVar2;
  string backupPath;
  string path;
  Dictionary settings;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  Dictionary local_80;
  
  if ((this->m_path)._M_string_length == 0) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    local_c0.field_2._M_local_buf[0] = '\0';
    pDVar2 = SessionSettings::get(&this->m_settings,s);
    Dictionary::Dictionary(&local_80,pDVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"FileLogPath",&local_101);
    Dictionary::getString(&local_e0,&local_80,&local_100,false);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::_M_assign((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"FileLogBackupPath",(allocator<char> *)&local_100);
    bVar1 = Dictionary::has(&local_80,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"FileLogBackupPath",&local_101);
      Dictionary::getString(&local_e0,&local_80,&local_100,false);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
    }
    this_00 = (FileLog *)operator_new(0x488);
    FileLog::FileLog(this_00,&local_a0,&local_c0,s);
    Dictionary::~Dictionary(&local_80);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else if ((this->m_backupPath)._M_string_length == 0) {
    this_00 = (FileLog *)operator_new(0x488);
    FileLog::FileLog(this_00,&this->m_path,s);
  }
  else {
    this_00 = (FileLog *)operator_new(0x488);
    FileLog::FileLog(this_00,&this->m_path,&this->m_backupPath,s);
  }
  return &this_00->super_Log;
}

Assistant:

Log *FileLogFactory::create(const SessionID &s) {
  if (m_path.size() && m_backupPath.size()) {
    return new FileLog(m_path, m_backupPath, s);
  }
  if (m_path.size()) {
    return new FileLog(m_path, s);
  }

  std::string path;
  std::string backupPath;
  Dictionary settings = m_settings.get(s);
  path = settings.getString(FILE_LOG_PATH);
  backupPath = path;
  if (settings.has(FILE_LOG_BACKUP_PATH)) {
    backupPath = settings.getString(FILE_LOG_BACKUP_PATH);
  }

  return new FileLog(path, backupPath, s);
}